

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharGraph.cpp
# Opt level: O3

int __thiscall
Hpipe::CharGraph::clone(CharGraph *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  char **args_2;
  pointer pAVar1;
  CharGraph *pCVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  long in_RAX;
  size_t sVar9;
  undefined7 extraout_var;
  long extraout_RAX;
  Lexem *pLVar10;
  long *plVar11;
  Lexem *pLVar12;
  __fn *p_Var13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  Lexem *pLVar15;
  Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX;
  Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_00;
  Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_01;
  Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_02;
  Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *val;
  void *__arg_00;
  string *__x;
  char *in_R9;
  pointer src;
  long lVar16;
  long *plVar17;
  Vec<Hpipe::CharGraph::Arg> cargs;
  Lexem *ch;
  string local_210;
  CharGraph *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  Vec<Hpipe::CharGraph::Arg> *local_1c8;
  long *local_1c0;
  string local_1b8;
  __fn *local_198;
  long *local_190;
  Pool<Hpipe::Lexem,32> *local_188;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  char *local_80;
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_78;
  string *local_70;
  string local_68;
  vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_> local_48;
  
  pLVar10 = (Lexem *)*___flags;
  if (pLVar10 != (Lexem *)0x0) {
    local_188 = (Pool<Hpipe::Lexem,32> *)&this->le_pool;
    local_78 = &this->calls;
    local_1f0 = this;
    local_1c8 = (Vec<Hpipe::CharGraph::Arg> *)__arg;
    local_1c0 = ___flags;
    local_198 = __fn;
    local_190 = (long *)__child_stack;
    local_80 = in_R9;
    do {
      pcVar3 = local_80;
      paVar14 = &local_210.field_2;
      if (local_80 != (char *)0x0) {
        local_210._M_dataplus._M_p = (pointer)paVar14;
        sVar9 = strlen(local_80);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,pcVar3,pcVar3 + sVar9);
        bVar4 = Lexem::eq(pLVar10,OPERATOR,&local_210);
        in_RAX = CONCAT71(extraout_var,bVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar14) {
          operator_delete(local_210._M_dataplus._M_p,
                          (ulong)(local_210.field_2._M_allocated_capacity + 1));
          in_RAX = extraout_RAX;
        }
        if (bVar4) break;
        pLVar10 = (Lexem *)*local_1c0;
      }
      plVar17 = local_1c0;
      if (pLVar10->type == VARIABLE) {
        iVar8 = std::__cxx11::string::compare((char *)&pLVar10->str);
        pLVar10 = (Lexem *)*plVar17;
        if (iVar8 == 0) goto LAB_0013c7ac;
        local_68._M_dataplus._M_p = (pointer)0x0;
        local_68._M_string_length = 0;
        local_68.field_2._M_allocated_capacity = 0;
        __x = &local_68;
        clone(local_1f0,local_198,local_190,(int)pLVar10 + 8,pLVar10,__x,local_1c8);
LAB_0013d123:
        std::vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>::~vector
                  ((vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_> *)__x);
      }
      else {
LAB_0013c7ac:
        local_210.field_2._M_allocated_capacity._0_2_ = 0x5b;
        local_210._M_string_length = 1;
        local_210._M_dataplus._M_p = (pointer)paVar14;
        bVar4 = Lexem::eq(pLVar10,OPERATOR,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar14) {
          operator_delete(local_210._M_dataplus._M_p,
                          (ulong)(local_210.field_2._M_allocated_capacity + 1));
        }
        if (bVar4) {
          pLVar10 = *(Lexem **)(*plVar17 + 0x38);
          local_210._M_string_length = 4;
          local_210.field_2._M_allocated_capacity._0_5_ = 0x70696b73;
          local_210._M_dataplus._M_p = (pointer)paVar14;
          bVar5 = Lexem::eq(pLVar10,&local_210);
          bVar6 = true;
          if (!bVar5) {
            local_1d8._M_allocated_capacity = 0x7274735f646461;
            local_1e8._8_8_ = 7;
            local_1e8._M_allocated_capacity = (size_type)&local_1d8;
            bVar5 = Lexem::eq(pLVar10,(string *)&local_1e8);
            bVar6 = true;
            if (!bVar5) {
              local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
              local_1b8.field_2._M_allocated_capacity._0_4_ = 0x5f726c63;
              local_1b8._M_string_length = 7;
              local_1b8.field_2._M_allocated_capacity._4_4_ = 0x727473;
              bVar5 = Lexem::eq(pLVar10,&local_1b8);
              bVar6 = true;
              if (!bVar5) {
                local_160._0_8_ = local_160 + 0x10;
                local_160._16_4_ = 0x5f676562;
                local_160._8_8_ = 7;
                local_160._20_4_ = 0x727473;
                bVar5 = Lexem::eq(pLVar10,(string *)local_160);
                bVar6 = true;
                if (!bVar5) {
                  local_180._0_8_ = local_180 + 0x10;
                  local_180._16_8_ = 0x5f7274735f676562;
                  local_180._24_4_ = 0x7478656e;
                  local_180._8_8_ = 0xc;
                  local_180[0x1c] = '\0';
                  bVar5 = Lexem::eq(pLVar10,(string *)local_180);
                  bVar6 = true;
                  if (!bVar5) {
                    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                    local_c0.field_2._M_allocated_capacity._0_4_ = 0x5f646e65;
                    local_c0._M_string_length = 7;
                    local_c0.field_2._M_allocated_capacity._4_4_ = 0x727473;
                    bVar5 = Lexem::eq(pLVar10,&local_c0);
                    bVar6 = true;
                    if (!bVar5) {
                      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
                      local_e0.field_2._M_allocated_capacity = 0x5f7274735f646e65;
                      local_e0.field_2._8_4_ = 0x7478656e;
                      local_e0._M_string_length = 0xc;
                      local_e0.field_2._M_local_buf[0xc] = '\0';
                      bVar5 = Lexem::eq(pLVar10,&local_e0);
                      bVar6 = true;
                      if (!bVar5) {
                        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
                        local_100.field_2._M_allocated_capacity._0_7_ = 0x636e695f646461;
                        local_100.field_2._7_4_ = 0x6564756c;
                        local_100._M_string_length = 0xb;
                        local_100.field_2._M_local_buf[0xb] = '\0';
                        bVar5 = Lexem::eq(pLVar10,&local_100);
                        bVar6 = true;
                        if (!bVar5) {
                          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                          local_140.field_2._0_8_ = 0x6c6572705f646461;
                          local_140._M_string_length = 8;
                          local_140.field_2._M_local_buf[8] = '\0';
                          bVar5 = Lexem::eq(pLVar10,&local_140);
                          bVar6 = true;
                          if (!bVar5) {
                            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
                            local_120.field_2._8_7_ = 0x7972616e696d69;
                            local_120.field_2._M_allocated_capacity._0_7_ = 0x6572705f646461;
                            local_120.field_2._M_local_buf[7] = 'l';
                            local_120._M_string_length = 0xf;
                            local_120.field_2._M_local_buf[0xf] = '\0';
                            bVar5 = Lexem::eq(pLVar10,&local_120);
                            bVar6 = true;
                            if (!bVar5) {
                              local_a0.field_2._M_allocated_capacity = 0x697261765f646461;
                              local_a0.field_2._8_4_ = 0x656c6261;
                              local_a0._M_string_length = 0xc;
                              local_a0.field_2._M_local_buf[0xc] = '\0';
                              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                              bVar6 = Lexem::eq(pLVar10,&local_a0);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                                operator_delete(local_a0._M_dataplus._M_p,
                                                local_a0.field_2._M_allocated_capacity + 1);
                              }
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
                              operator_delete(local_120._M_dataplus._M_p,
                                              CONCAT17(local_120.field_2._M_local_buf[7],
                                                       local_120.field_2._M_allocated_capacity._0_7_
                                                      ) + 1);
                            }
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_140._M_dataplus._M_p != &local_140.field_2) {
                            operator_delete(local_140._M_dataplus._M_p,local_140.field_2._0_8_ + 1);
                          }
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_100._M_dataplus._M_p != &local_100.field_2) {
                          operator_delete(local_100._M_dataplus._M_p,
                                          CONCAT17(local_100.field_2._M_local_buf[7],
                                                   local_100.field_2._M_allocated_capacity._0_7_) +
                                          1);
                        }
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                        operator_delete(local_e0._M_dataplus._M_p,
                                        local_e0.field_2._M_allocated_capacity + 1);
                      }
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                      operator_delete(local_c0._M_dataplus._M_p,
                                      CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                                               local_c0.field_2._M_allocated_capacity._0_4_) + 1);
                    }
                  }
                  if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
                    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
                  }
                }
                if ((Lexem *)local_160._0_8_ != (Lexem *)(local_160 + 0x10)) {
                  operator_delete((void *)local_160._0_8_,
                                  CONCAT44(local_160._20_4_,local_160._16_4_) + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                operator_delete(local_1b8._M_dataplus._M_p,
                                CONCAT44(local_1b8.field_2._M_allocated_capacity._4_4_,
                                         local_1b8.field_2._M_allocated_capacity._0_4_) + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_allocated_capacity != &local_1d8) {
              operator_delete((void *)local_1e8._M_allocated_capacity,
                              local_1d8._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != paVar14) {
            operator_delete(local_210._M_dataplus._M_p,
                            (ulong)(local_210.field_2._M_allocated_capacity + 1));
          }
          if (bVar6 == false) {
            __x = &local_210;
            get_cargs((Vec<Hpipe::CharGraph::Arg> *)__x,local_1f0,*(Lexem **)(*plVar17 + 0x40),
                      local_1c8,true);
            __arg_00 = *(void **)(*plVar17 + 0x38);
            if (*(int *)((long)__arg_00 + 0x28) != 1) {
              Lexer::err(local_1f0->lexer,*(Lexem **)(*plVar17 + 0x40),
                         "xxx in xxx[] should be a variable");
              local_1f0->ok = false;
              __arg_00 = *(void **)(*plVar17 + 0x38);
            }
            std::vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>::vector
                      (&local_48,
                       (vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_> *)__x)
            ;
            clone(local_1f0,local_198,local_190,(int)__arg_00 + 8,__arg_00,&local_48,local_1c8);
            std::vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>::~vector
                      (&local_48);
            goto LAB_0013d123;
          }
        }
        args_2 = (char **)*plVar17;
        pLVar10 = Pool<Hpipe::Lexem,32>::
                  New<Hpipe::Lexem::Type_const&,Hpipe::Source*const&,char_const*const&,std::__cxx11::string_const&>
                            (local_188,(anon_enum_32 *)(args_2 + 5),(Source **)(args_2 + 6),args_2,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (args_2 + 1));
        p_Var13 = (__fn *)(*local_190 + 0x50);
        if (*(long *)local_198 == 0) {
          p_Var13 = local_198;
        }
        *(Lexem **)p_Var13 = pLVar10;
        *local_190 = (long)pLVar10;
        if ((*(int *)(*plVar17 + 0x28) == 8) || (*(int *)(*plVar17 + 0x28) == 4)) {
          src = (local_1c8->
                super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>).
                super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>.
                _M_impl.super__Vector_impl_data._M_start;
          pAVar1 = (local_1c8->
                   super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>).
                   super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (src != pAVar1) {
            local_70 = &pLVar10->str;
            do {
              pLVar12 = src->val;
              local_210.field_2._M_allocated_capacity._0_2_ = 0x28;
              local_210._M_string_length = 1;
              local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
              bVar5 = Lexem::eq(pLVar12,OPERATOR,&local_210);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_210._M_dataplus._M_p != &local_210.field_2) {
                operator_delete(local_210._M_dataplus._M_p,
                                (ulong)(local_210.field_2._M_allocated_capacity + 1));
              }
              pCVar2 = local_1f0;
              if (bVar5) {
                pLVar12 = pLVar12->children[0];
              }
              if (pLVar12->next != (Lexem *)0x0) {
                Lexer::err(local_1f0->lexer,pLVar12->next,
                           "When a variable is used in a code, it is expected to be a single lexem")
                ;
                pCVar2->ok = false;
              }
              repl_all(local_70,&src->name,&pLVar12->str);
              src = src + 1;
            } while (src != pAVar1);
          }
        }
        lVar16 = 0;
        plVar17 = local_1c0;
        bVar5 = true;
        do {
          bVar6 = bVar5;
          pLVar12 = ((Lexem *)*plVar17)->children[lVar16];
          local_160._0_8_ = pLVar12;
          if (pLVar12 != (Lexem *)0x0) {
            if (bVar6) {
              local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
              local_210._M_string_length = 2;
              local_210.field_2._M_allocated_capacity._0_3_ = 0x3e2d;
              bVar5 = Lexem::eq((Lexem *)*plVar17,OPERATOR,&local_210);
              bVar7 = true;
              val = extraout_RDX;
              if (!bVar5) {
                local_1e8._8_8_ = 2;
                local_1d8._M_allocated_capacity._0_3_ = 0x2d3c;
                local_1e8._M_allocated_capacity = (size_type)&local_1d8;
                bVar7 = Lexem::eq((Lexem *)*plVar17,OPERATOR,(string *)&local_1e8);
                val = extraout_RDX_00;
                plVar17 = local_1c0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_allocated_capacity != &local_1d8) {
                  operator_delete((void *)local_1e8._M_allocated_capacity,
                                  local_1d8._M_allocated_capacity + 1);
                  val = extraout_RDX_01;
                  plVar17 = local_1c0;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_210._M_dataplus._M_p != &local_210.field_2) {
                operator_delete(local_210._M_dataplus._M_p,
                                (ulong)(local_210.field_2._M_allocated_capacity + 1));
                val = extraout_RDX_02;
              }
              if (bVar7 == false) {
                if (!bVar4) goto LAB_0013cf20;
                pLVar12 = Pool<Hpipe::Lexem,32>::
                          New<Hpipe::Lexem::Type_const&,Hpipe::Source*const&,char_const*const&,std::__cxx11::string_const&>
                                    (local_188,&pLVar12->type,&pLVar12->source,&pLVar12->beg,
                                     &pLVar12->str);
                pLVar10->children[0] = pLVar12;
              }
              else {
                local_180._0_8_ = local_78;
                to_string<Hpipe::Values<Hpipe::Vec<std::__cxx11::string>>>
                          (&local_1b8,(Hpipe *)local_180,val);
                plVar11 = (long *)std::__cxx11::string::append((char *)&local_1b8);
                local_1e8._M_allocated_capacity = (size_type)&local_1d8;
                paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 == paVar14) {
                  local_1d8._M_allocated_capacity = paVar14->_M_allocated_capacity;
                  local_1d8._8_8_ = plVar11[3];
                }
                else {
                  local_1d8._M_allocated_capacity = paVar14->_M_allocated_capacity;
                  local_1e8._M_allocated_capacity =
                       (size_type)
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*plVar11;
                }
                local_1e8._8_8_ = plVar11[1];
                *plVar11 = (long)paVar14;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                plVar11 = (long *)std::__cxx11::string::_M_append
                                            (local_1e8._M_local_buf,
                                             (ulong)(pLVar12->str)._M_dataplus._M_p);
                local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
                pLVar15 = (Lexem *)(plVar11 + 2);
                if ((Lexem *)*plVar11 == pLVar15) {
                  local_210.field_2._M_allocated_capacity = (size_type)pLVar15->beg;
                  local_210.field_2._8_8_ = plVar11[3];
                }
                else {
                  local_210.field_2._M_allocated_capacity = (size_type)pLVar15->beg;
                  local_210._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_210._M_string_length = plVar11[1];
                *plVar11 = (long)pLVar15;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                pLVar12 = Pool<Hpipe::Lexem,32>::
                          New<Hpipe::Lexem::Type_const&,Hpipe::Source*const&,char_const*const&,std::__cxx11::string>
                                    (local_188,&pLVar12->type,&pLVar12->source,&pLVar12->beg,
                                     &local_210);
                pLVar10->children[0] = pLVar12;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_210._M_dataplus._M_p != &local_210.field_2) {
                  operator_delete(local_210._M_dataplus._M_p,
                                  (ulong)(local_210.field_2._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_allocated_capacity != &local_1d8) {
                  operator_delete((void *)local_1e8._M_allocated_capacity,
                                  local_1d8._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                  operator_delete(local_1b8._M_dataplus._M_p,
                                  CONCAT44(local_1b8.field_2._M_allocated_capacity._4_4_,
                                           local_1b8.field_2._M_allocated_capacity._0_4_) + 1);
                }
              }
            }
            else {
LAB_0013cf20:
              local_210._M_dataplus._M_p = (pointer)0x0;
              local_1e8._M_allocated_capacity = 0;
              clone(local_1f0,(__fn *)&local_210,&local_1e8,(int)local_160,local_1c8,0);
              pLVar10->children[lVar16] = (Lexem *)local_210._M_dataplus._M_p;
            }
            pLVar10->children[lVar16]->parent = pLVar10;
          }
          lVar16 = 1;
          bVar5 = false;
        } while (bVar6);
      }
      in_RAX = *plVar17;
      pLVar10 = *(Lexem **)(in_RAX + 0x50);
      *plVar17 = (long)pLVar10;
    } while (pLVar10 != (Lexem *)0x0);
  }
  return (int)in_RAX;
}

Assistant:

void CharGraph::clone( Lexem *&beg, Lexem *&end, const Lexem *&l, const Vec<Arg> &args, const char *stop ) {
    for( ; l; l = l->next ) {
        if ( stop and l->eq( Lexem::OPERATOR, stop ) )
            break;

        // variables
        auto keyword = []( const std::string &str ) {
            return str == "eof";
        };
        if ( l->type == Lexem::VARIABLE and not keyword( l->str ) ) {
            clone( beg, end, l->str, l, {}, args );
            continue;
        }

        // function call ( func[ args ] )
        auto is_inline = []( const Lexem *l ) {
            return l->eq( "skip" ) or l->eq( "add_str" ) or l->eq( "clr_str" ) or l->eq( "beg_str" )  or l->eq( "beg_str_next" ) or l->eq( "end_str" )  or l->eq( "end_str_next" ) or
                   l->eq( "add_include" ) or l->eq( "add_prel" ) or l->eq( "add_preliminary" ) or l->eq( "add_variable" );
        };

        bool do_not_clone_ch_0 = false;
        if ( l->eq( Lexem::OPERATOR, "[" ) ) {
            if ( is_inline( l->children[ 0 ] ) ) {
                do_not_clone_ch_0 = true;
            } else {
                // get arguments
                Vec<Arg> cargs = get_cargs( l->children[ 1 ], args, true );

                // find machine
                if ( l->children[ 0 ]->type != Lexem::VARIABLE ) {
                    lexer.err( l->children[ 1 ], "xxx in xxx[] should be a variable" );
                    ok = false;
                }
                clone( beg, end, l->children[ 0 ]->str, l->children[ 0 ], cargs, args );
                continue;
            }
        }

        // default case
        Lexem *res = le_pool.New( l->type, l->source, l->beg, l->str );
        if ( beg ) end->next = res;
        else beg = res;
        end = res;

        // modifications
        switch ( l->type ) {
        case Lexem::STRING:
        case Lexem::CODE:
            for( const Arg &arg : args ) {
                const Lexem *val = arg.val;
                if ( val->eq( Lexem::OPERATOR, "(" ) )
                    val = val->children[ 0 ];
                if ( val->next ) {
                    lexer.err( val->next, "When a variable is used in a code, it is expected to be a single lexem" );
                    ok = false;
                }
                repl_all( res->str, arg.name, val->str );
            }
            break;
        default:
            break;
        }

        for( unsigned i = 0; i < 2; ++i ) {
            if ( const Lexem *ch = l->children[ i ] ) {
                if ( i == 0 and ( l->eq( Lexem::OPERATOR, "->" ) or l->eq( Lexem::OPERATOR, "<-" ) ) )
                    res->children[ i ] = le_pool.New( ch->type, ch->source, ch->beg, to_string( values( calls ) ) + " " + ch->str );
                else if ( i == 0 and do_not_clone_ch_0 )
                    res->children[ i ] = le_pool.New( ch->type, ch->source, ch->beg, ch->str );
                else
                    res->children[ i ] = clone( ch, args );
                res->children[ i ]->parent = res;
            }
        }
    }
}